

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginGroup(void)

{
  float fVar1;
  ImVec2 local_28;
  ImGuiGroupData *local_20;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  group_data = (ImGuiGroupData *)GImGui->CurrentWindow;
  ImVector<ImGuiGroupData>::resize(&GImGui->GroupStack,(GImGui->GroupStack).Size + 1);
  local_20 = ImVector<ImGuiGroupData>::back
                       ((ImVector<ImGuiGroupData> *)&window[7].DC.TextWrapPosStack);
  local_20->WindowID = (ImGuiID)(group_data->BackupCursorPos).y;
  local_20->BackupCursorPos = *(ImVec2 *)&group_data[5].BackupCurrLineSize.y;
  local_20->BackupCursorMaxPos = *(ImVec2 *)&group_data[6].BackupCursorPos.y;
  (local_20->BackupIndent).x = (float)group_data[7].WindowID;
  (local_20->BackupGroupOffset).x = group_data[7].BackupCursorPos.y;
  fVar1 = group_data[6].BackupCurrLineSize.x;
  (local_20->BackupCurrLineSize).x = group_data[6].BackupGroupOffset.x;
  (local_20->BackupCurrLineSize).y = fVar1;
  local_20->BackupCurrLineTextBaseOffset = (float)group_data[6].BackupActiveIdIsAlive;
  local_20->BackupActiveIdIsAlive = (ImGuiID)window[7].SizeFull.x;
  local_20->BackupHoveredIdIsAlive = window[7].ViewportPos.y != 0.0;
  local_20->BackupActiveIdPreviousFrameIsAlive = (bool)(*(byte *)&window[7].Scroll.x & 1);
  local_20->EmitItem = true;
  group_data[7].BackupCursorPos.y =
       (group_data[5].BackupCurrLineSize.y - group_data[1].BackupGroupOffset.x) -
       group_data[7].BackupCursorPos.x;
  group_data[7].WindowID = (ImGuiID)group_data[7].BackupCursorPos.y;
  *(undefined8 *)&group_data[6].BackupCursorPos.y =
       *(undefined8 *)&group_data[5].BackupCurrLineSize.y;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  group_data[6].BackupGroupOffset = (ImVec1)local_28.x;
  group_data[6].BackupCurrLineSize.x = local_28.y;
  if ((window[0xc].BeginOrderWithinParent & 1) != 0) {
    *(undefined4 *)&window[0xc].IDStack.Data = 0xff7fffff;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}